

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O1

void ParseSmpl(SFFile *sf2,FileReader *f,DWORD chunkid,DWORD chunklen)

{
  DWORD DVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 uVar3;
  undefined4 in_register_00000014;
  pointer_____offset_0x10___ *ppuVar4;
  
  if (sf2->SampleDataOffset == 0) {
    if ((chunklen & 1) != 0) {
      uVar3 = __cxa_allocate_exception(1,f,CONCAT44(in_register_00000014,chunkid));
      ppuVar4 = &CBadForm::typeinfo;
      goto LAB_0032642a;
    }
    DVar1 = (*(f->super_FileReaderBase)._vptr_FileReaderBase[3])(f);
    sf2->SampleDataOffset = DVar1;
    sf2->SizeSampleData = chunklen >> 1;
  }
  iVar2 = (*(f->super_FileReaderBase)._vptr_FileReaderBase[4])
                    (f,(ulong)((chunklen & 1) + chunklen),1);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    return;
  }
  uVar3 = __cxa_allocate_exception(1);
  ppuVar4 = &CIOErr::typeinfo;
LAB_0032642a:
  __cxa_throw(uVar3,ppuVar4,0);
}

Assistant:

static void ParseSmpl(SFFile *sf2, FileReader *f, DWORD chunkid, DWORD chunklen)
{
	// Only use the first smpl chunk. (Or should we reject files with more than one?)
	if (sf2->SampleDataOffset == 0)
	{
		if (chunklen & 1)
		{ // Chunk must be an even number of bytes.
			throw CBadForm();
		}
		sf2->SampleDataOffset = f->Tell();
		sf2->SizeSampleData = chunklen >> 1;
	}
	skip_chunk(f, chunklen);
}